

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControlPrivate::repaintOldAndNewSelection
          (QWidgetTextControlPrivate *this,QTextCursor *oldSelection)

{
  QObject *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  MoveMode MVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QTextCursor differenceSelection;
  QRectF local_a8;
  QRectF local_88;
  QRectF local_68;
  void *local_48;
  QRectF *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)&this->field_0x8;
  cVar1 = QTextCursor::hasSelection();
  if (cVar1 != '\0') {
    cVar1 = QTextCursor::hasSelection();
    if (cVar1 != '\0') {
      lVar5 = QTextCursor::currentFrame();
      lVar6 = QTextCursor::currentFrame();
      if (lVar5 == lVar6) {
        cVar1 = QTextCursor::hasComplexSelection();
        if (cVar1 == '\0') {
          cVar1 = QTextCursor::hasComplexSelection();
          if (cVar1 == '\0') {
            iVar2 = QTextCursor::anchor();
            iVar3 = QTextCursor::anchor();
            if (iVar2 == iVar3) {
              local_a8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              QTextCursor::QTextCursor((QTextCursor *)&local_a8,this->doc);
              MVar4 = QTextCursor::position();
              QTextCursor::setPosition((int)&local_a8,MVar4);
              MVar4 = QTextCursor::position();
              QTextCursor::setPosition((int)&local_a8,MVar4);
              QWidgetTextControl::selectionRect
                        (&local_88,(QWidgetTextControl *)this_00,(QTextCursor *)&local_a8);
              local_68.xp = 0.0;
              local_68.yp = (qreal)&local_88;
              QMetaObject::activate
                        (this_00,&QWidgetTextControl::staticMetaObject,7,(void **)&local_68);
              QTextCursor::~QTextCursor((QTextCursor *)&local_a8);
              goto LAB_004c5847;
            }
          }
        }
      }
    }
  }
  cVar1 = QTextCursor::isNull();
  if (cVar1 == '\0') {
    QWidgetTextControl::selectionRect(&local_68,(QWidgetTextControl *)this_00,oldSelection);
    cursorRectPlusUnicodeDirectionMarkers(&local_a8,this,oldSelection);
    QRectF::operator|(&local_88,&local_68);
    local_48 = (void *)0x0;
    pQStack_40 = &local_88;
    QMetaObject::activate(this_00,&QWidgetTextControl::staticMetaObject,7,&local_48);
  }
  QWidgetTextControl::selectionRect
            (&local_68,(QWidgetTextControl *)this_00,(QTextCursor *)(*(long *)(this_00 + 8) + 0x88))
  ;
  cursorRectPlusUnicodeDirectionMarkers(&local_a8,this,&this->cursor);
  QRectF::operator|(&local_88,&local_68);
  local_48 = (void *)0x0;
  pQStack_40 = &local_88;
  QMetaObject::activate(this_00,&QWidgetTextControl::staticMetaObject,7,&local_48);
LAB_004c5847:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::repaintOldAndNewSelection(const QTextCursor &oldSelection)
{
    Q_Q(QWidgetTextControl);
    if (cursor.hasSelection()
        && oldSelection.hasSelection()
        && cursor.currentFrame() == oldSelection.currentFrame()
        && !cursor.hasComplexSelection()
        && !oldSelection.hasComplexSelection()
        && cursor.anchor() == oldSelection.anchor()
        ) {
        QTextCursor differenceSelection(doc);
        differenceSelection.setPosition(oldSelection.position());
        differenceSelection.setPosition(cursor.position(), QTextCursor::KeepAnchor);
        emit q->updateRequest(q->selectionRect(differenceSelection));
    } else {
        if (!oldSelection.isNull())
            emit q->updateRequest(q->selectionRect(oldSelection) | cursorRectPlusUnicodeDirectionMarkers(oldSelection));
        emit q->updateRequest(q->selectionRect() | cursorRectPlusUnicodeDirectionMarkers(cursor));
    }
}